

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

size_t __thiscall soul::AST::ModuleBase::countEndpoints(ModuleBase *this,bool countInputs)

{
  int iVar1;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  undefined4 extraout_var;
  size_t sVar3;
  long *extraout_RDX;
  long *plVar2;
  
  iVar1 = (*(this->super_ASTObject)._vptr_ASTObject[8])();
  sVar3 = 0;
  for (plVar2 = (long *)CONCAT44(extraout_var,iVar1); plVar2 != extraout_RDX; plVar2 = plVar2 + 1) {
    sVar3 = sVar3 + ((bool)*(char *)(*plVar2 + 0x28) == countInputs);
  }
  return sVar3;
}

Assistant:

size_t countEndpoints (bool countInputs) const
        {
            size_t num = 0;

            for (auto& e : getEndpoints())
                if (e->isInput == countInputs)
                    ++num;

            return num;
        }